

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grades.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  string input;
  char *stopped;
  int gradeArray [6];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Welcome to the grading program!");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Please type each grade, followed by the return key.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Grades can be in the range of 0-5. Type \'exit\' to leave.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  gradeArray[4] = 0;
  gradeArray[5] = 0;
  gradeArray[0] = 0;
  gradeArray[1] = 0;
  gradeArray[2] = 0;
  gradeArray[3] = 0;
  do {
    input._M_dataplus._M_p = (pointer)&input.field_2;
    input._M_string_length = 0;
    input.field_2._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,"Grade: ");
    std::operator>>((istream *)&std::cin,(string *)&input);
    bVar1 = std::operator==(&input,"exit");
    if (bVar1) {
      printGrades(gradeArray,6);
    }
    else {
      uVar3 = strtol(input._M_dataplus._M_p,&stopped,10);
      if (stopped < input._M_dataplus._M_p + input._M_string_length) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Invalid non-numeric string!");
      }
      else {
        if (uVar3 < 6) {
          gradeArray[uVar3] = gradeArray[uVar3] + 1;
          goto LAB_001013a0;
        }
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "Invalid grade number. Please enter a number between 0 and ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,5);
      }
      std::endl<char,std::char_traits<char>>(poVar2);
    }
LAB_001013a0:
    std::__cxx11::string::~string((string *)&input);
    if (bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int main()
{
    cout << "Welcome to the grading program!" << endl;
    cout << "Please type each grade, followed by the return key." << endl;
    cout << "Grades can be in the range of 0-5. Type 'exit' to leave." << endl << endl;

    bool continueGrading = true;
    int gradeArray[NUM_GRADE_COLUMNS] = { 0 };

    do
    {
        string input;
        cout << "Grade: ";
        cin >> input;

        if(input == "exit")
        {
            printGrades(gradeArray, NUM_GRADE_COLUMNS);
            continueGrading = false;
            continue;
        }

        char* stopped;
        long grade = strtol(input.c_str(), &stopped, 10);


        //we can use pointer arithmetic in order to figure out if strtol stopped before the end of the string
        //This is documented in the c++ online reference. If it reads in the whole string it should be pointing
        //At the \0 (end) of the string

        if(stopped >= (input.c_str() + input.length()))
        {
            if(grade >= 0 && grade < NUM_GRADE_COLUMNS)
            {
                addGrade(static_cast<int>(grade), gradeArray);
            }
            else
            {
                cout << "Invalid grade number. Please enter a number between 0 and " << (NUM_GRADE_COLUMNS - 1) << endl;
                continue;
            }
        }
        else
        {
            cout << "Invalid non-numeric string!" << endl;
            continue;
        }




    }
    while(continueGrading);
}